

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_util.c
# Opt level: O0

int psa_pk_status_to_mbedtls(psa_status_t status)

{
  int local_c;
  psa_status_t status_local;
  
  switch(status) {
  case -0x99:
  case -0x98:
  case -0x92:
    local_c = -0x3e00;
    break;
  default:
    local_c = psa_generic_status_to_mbedtls(status);
    break;
  case -0x8d:
    local_c = -0x3f80;
    break;
  case -0x8a:
    local_c = -0x3880;
    break;
  case -0x89:
    local_c = -16000;
    break;
  case -0x88:
    local_c = -0x3d00;
    break;
  case -0x87:
    local_c = -0x3a80;
    break;
  case -0x86:
    local_c = -0x3980;
  }
  return local_c;
}

Assistant:

int psa_pk_status_to_mbedtls(psa_status_t status)
{
    switch (status) {
        case PSA_ERROR_INVALID_HANDLE:
            return MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;
        case PSA_ERROR_BUFFER_TOO_SMALL:
            return MBEDTLS_ERR_PK_BUFFER_TOO_SMALL;
        case PSA_ERROR_NOT_SUPPORTED:
            return MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE;
        case PSA_ERROR_INVALID_ARGUMENT:
            return MBEDTLS_ERR_PK_INVALID_ALG;
        case PSA_ERROR_INSUFFICIENT_MEMORY:
            return MBEDTLS_ERR_PK_ALLOC_FAILED;
        case PSA_ERROR_BAD_STATE:
            return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
        case PSA_ERROR_DATA_CORRUPT:
        case PSA_ERROR_DATA_INVALID:
        case PSA_ERROR_STORAGE_FAILURE:
            return MBEDTLS_ERR_PK_FILE_IO_ERROR;
        default:
            return psa_generic_status_to_mbedtls(status);
    }
}